

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool minihttp::SplitURI(string *uri,string *protocol,string *host,string *file,int *port,
                       bool *useSSL)

{
  byte bVar1;
  pointer pcVar2;
  long lVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *__haystack;
  long lVar10;
  string *psVar11;
  char *pcVar12;
  uint uVar13;
  string *psVar14;
  undefined1 auStack_ab [3];
  ulong uStack_a8;
  ulong uStack_a0;
  string *psStack_98;
  pointer pcStack_90;
  string *psStack_88;
  code *pcStack_80;
  string *local_70;
  string *local_68;
  int *local_60;
  bool *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  __haystack = (uri->_M_dataplus)._M_p;
  pcStack_80 = (code *)0x1065f5;
  local_70 = file;
  local_68 = host;
  local_58 = useSSL;
  pcVar7 = strstr(__haystack,"//");
  *port = -1;
  local_60 = port;
  if (pcVar7 == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    pcStack_80 = (code *)0x10661c;
    uVar8 = std::__cxx11::string::find((char)uri,0x3a);
    pcStack_80 = (code *)0x10662e;
    uVar9 = std::__cxx11::string::find((char)uri,0x2f);
    if (uVar8 < uVar9) {
      pcStack_80 = (code *)0x106648;
      std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
      pcStack_80 = (code *)0x106653;
      std::__cxx11::string::operator=((string *)protocol,(string *)local_50);
      if (local_50[0] != local_40) {
        pcStack_80 = (code *)0x10666d;
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    pcStack_80 = (code *)0x106687;
    iVar5 = strncmp(__haystack,"http://",7);
    if (iVar5 == 0) {
      iVar6 = 0x50;
    }
    else {
      pcStack_80 = (code *)0x1066a8;
      iVar6 = strncmp(__haystack,"https://",8);
      if (iVar6 != 0) {
        return false;
      }
      iVar6 = 0x1bb;
    }
    uVar8 = (ulong)CONCAT31((int3)((uint)iVar5 >> 8),iVar5 != 0);
    *local_60 = iVar6;
    __haystack = pcVar7 + 2;
  }
  pcStack_80 = (code *)0x1066e9;
  pcVar7 = strchr(__haystack,0x2f);
  psVar14 = local_68;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (char *)local_68->_M_string_length;
    pcStack_80 = (code *)0x106766;
    strlen(__haystack);
    pcStack_80 = (code *)0x106779;
    std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar7,(ulong)__haystack);
    pcVar12 = (char *)local_70->_M_string_length;
    pcVar7 = "/";
    psVar11 = local_70;
  }
  else {
    pcStack_80 = (code *)0x10670a;
    std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
    psVar14 = local_68;
    pcStack_80 = (code *)0x10671a;
    std::__cxx11::string::operator=((string *)local_68,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_80 = (code *)0x106734;
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uri = local_70;
    pcVar12 = (char *)local_70->_M_string_length;
    pcStack_80 = (code *)0x106745;
    strlen(pcVar7);
    psVar11 = uri;
  }
  pcStack_80 = (code *)0x106796;
  std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar12,(ulong)pcVar7);
  pcStack_80 = (code *)0x1067a5;
  uVar9 = std::__cxx11::string::find((char)psVar14,0x3a);
  if (uVar9 != 0xffffffffffffffff) {
    pcVar2 = (psVar14->_M_dataplus)._M_p;
    pcStack_80 = (code *)0x1067bd;
    iVar5 = atoi(pcVar2 + uVar9 + 1);
    *local_60 = iVar5;
    if (psVar14->_M_string_length < uVar9) {
      pcVar12 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar7 = "basic_string::erase";
      pcStack_80 = URLEncode;
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar9);
      lVar3 = *(long *)((long)pcVar12 + 8);
      if (lVar3 != 0) {
        lVar10 = 0;
        uStack_a8 = uVar9;
        uStack_a0 = uVar8;
        psStack_98 = uri;
        pcStack_90 = pcVar2;
        psStack_88 = psVar14;
        pcStack_80 = (code *)__haystack;
        do {
          bVar1 = *(byte *)(*(long *)pcVar12 + lVar10);
          uVar13 = (uint)bVar1;
          iVar5 = isalnum(uVar13);
          if ((((iVar5 == 0) && (2 < uVar13 - 0x2c)) && (bVar1 != 0x20)) && (uVar13 != 0x5f)) {
            uVar4 = std::__cxx11::string::append(pcVar7,(ulong)auStack_ab);
          }
          else {
            uVar4 = std::__cxx11::string::push_back((char)pcVar7);
          }
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
      }
      return (bool)uVar4;
    }
    psVar14->_M_string_length = uVar9;
    pcVar2[uVar9] = '\0';
  }
  *local_58 = SUB81(uVar8,0);
  return true;
}

Assistant:

bool SplitURI(const std::string& uri, std::string& protocol, std::string& host, std::string& file, int& port, bool& useSSL)
{
    const char *p = uri.c_str();
    const char *sl = strstr(p, "//");
    unsigned int offs = 0;
    port = -1;
    bool ssl = false;
    if(sl)
    {
        size_t colon = uri.find(':');
        size_t firstslash = uri.find('/');
        if(colon < firstslash)
            protocol = uri.substr(0, colon);
        if(strncmp(p, "http://", 7) == 0)
        {
            offs = 7;
            port = 80;
        }
        else if(strncmp(p, "https://", 8) == 0)
        {
            offs = 8;
            port = 443;
            ssl = true;
        }
        else
            return false;

        p = sl + 2;
    }

    sl = strchr(p, '/');
    if(!sl)
    {
        host = p;
        file = "/";
    }
    else
    {
        host = uri.substr(offs, sl - p);
        file = sl;
    }

    size_t colon = host.find(':');
    if(colon != std::string::npos)
    {
        port = atoi(host.c_str() + colon + 1);
        host.erase(colon);
    }
    useSSL = ssl;

    return true;
}